

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2measures.cc
# Opt level: O0

double S2::GirardArea(S2Point *a,S2Point *b,S2Point *c)

{
  double *pdVar1;
  FloatType FVar2;
  FloatType FVar3;
  FloatType FVar4;
  double local_78;
  double local_70;
  undefined1 local_68 [8];
  Vector3_d ac;
  Vector3_d bc;
  Vector3_d ab;
  S2Point *c_local;
  S2Point *b_local;
  S2Point *a_local;
  
  RobustCrossProd((Vector3_d *)(bc.c_ + 2),a,b);
  RobustCrossProd((Vector3_d *)(ac.c_ + 2),b,c);
  RobustCrossProd((Vector3_d *)local_68,a,c);
  local_70 = 0.0;
  FVar2 = Vector3<double>::Angle((Vector3<double> *)(bc.c_ + 2),(Vector3<double> *)local_68);
  FVar3 = Vector3<double>::Angle((Vector3<double> *)(bc.c_ + 2),(Vector3<double> *)(ac.c_ + 2));
  FVar4 = Vector3<double>::Angle((Vector3<double> *)(ac.c_ + 2),(Vector3<double> *)local_68);
  local_78 = (FVar2 - FVar3) + FVar4;
  pdVar1 = std::max<double>(&local_70,&local_78);
  return *pdVar1;
}

Assistant:

double GirardArea(const S2Point& a, const S2Point& b, const S2Point& c) {
  // This is equivalent to the usual Girard's formula but is slightly more
  // accurate, faster to compute, and handles a == b == c without a special
  // case.  RobustCrossProd() is necessary to get good accuracy when two of
  // the input points are very close together.

  Vector3_d ab = RobustCrossProd(a, b);
  Vector3_d bc = RobustCrossProd(b, c);
  Vector3_d ac = RobustCrossProd(a, c);
  return max(0.0, ab.Angle(ac) - ab.Angle(bc) + bc.Angle(ac));
}